

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.c
# Opt level: O0

void board_moveLinkMake(Board *board,MoveLink *lastLink)

{
  code *pcVar1;
  undefined8 *in_RSI;
  long i;
  Move *moveLinks [2048];
  long local_4020;
  undefined8 auStackY_4018 [2];
  Move *in_stack_ffffffffffffbff8;
  Board *in_stack_ffffffffffffc000;
  undefined8 *local_10;
  
  local_4020 = 0;
  local_10 = in_RSI;
  while( true ) {
    if (local_10 == (undefined8 *)0x0) {
      if (SBORROW8(local_4020,1)) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      do {
        local_4020 = local_4020 + -1;
        if (local_4020 < 0) {
          return;
        }
        board_moveMake(in_stack_ffffffffffffc000,in_stack_ffffffffffffbff8);
      } while (!SBORROW8(local_4020,1));
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    if (SCARRY8(local_4020,1)) break;
    auStackY_4018[local_4020] = *local_10;
    local_10 = (undefined8 *)local_10[1];
    local_4020 = local_4020 + 1;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void board_moveLinkMake(Board * board, MoveLink * lastLink)
{
	Move * moveLinks[2048];
	long i=0;

	while(lastLink)
	{
		moveLinks[i++] = lastLink->move;
		lastLink = lastLink->prev;
	}

	for(--i;i>=0;i--)
	{
		board_moveMake(board, moveLinks[i]);
	}
}